

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall llvm::raw_fd_ostream::write_impl(raw_fd_ostream *this,char *Ptr,size_t Size)

{
  int __v;
  unsigned_long *puVar1;
  int *piVar2;
  error_category *__cat;
  error_code EC;
  error_code local_48;
  ssize_t local_38;
  ssize_t ret;
  size_t ChunkSize;
  size_t MaxWriteSize;
  size_t Size_local;
  char *Ptr_local;
  raw_fd_ostream *this_local;
  
  MaxWriteSize = Size;
  Size_local = (size_t)Ptr;
  Ptr_local = (char *)this;
  if (this->FD < 0) {
    __assert_fail("FD >= 0 && \"File already closed.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x265,"virtual void llvm::raw_fd_ostream::write_impl(const char *, size_t)");
  }
  this->pos = Size + this->pos;
  ChunkSize = 0x40000000;
  do {
    puVar1 = std::min<unsigned_long>(&MaxWriteSize,&ChunkSize);
    ret = *puVar1;
    local_38 = write(this->FD,(void *)Size_local,ret);
    if (local_38 < 0) {
      piVar2 = __errno_location();
      if (((*piVar2 != 4) && (piVar2 = __errno_location(), *piVar2 != 0xb)) &&
         (piVar2 = __errno_location(), *piVar2 != 0xb)) {
        piVar2 = __errno_location();
        __v = *piVar2;
        __cat = (error_category *)std::_V2::generic_category();
        std::error_code::error_code(&local_48,__v,__cat);
        EC._4_4_ = 0;
        EC._M_value = local_48._M_value;
        EC._M_cat = local_48._M_cat;
        error_detected(this,EC);
        return;
      }
    }
    else {
      Size_local = local_38 + Size_local;
      MaxWriteSize = MaxWriteSize - local_38;
    }
    if (MaxWriteSize == 0) {
      return;
    }
  } while( true );
}

Assistant:

void raw_fd_ostream::write_impl(const char *Ptr, size_t Size) {
  assert(FD >= 0 && "File already closed.");
  pos += Size;

  // The maximum write size is limited to INT32_MAX. A write
  // greater than SSIZE_MAX is implementation-defined in POSIX,
  // and Windows _write requires 32 bit input.
  size_t MaxWriteSize = INT32_MAX;

#if defined(__linux__)
  // It is observed that Linux returns EINVAL for a very large write (>2G).
  // Make it a reasonably small value.
  MaxWriteSize = 1024 * 1024 * 1024;
#elif defined(_WIN32)
  // Writing a large size of output to Windows console returns ENOMEM. It seems
  // that, prior to Windows 8, WriteFile() is redirecting to WriteConsole(), and
  // the latter has a size limit (66000 bytes or less, depending on heap usage).
  if (::_isatty(FD) && !RunningWindows8OrGreater())
    MaxWriteSize = 32767;
#endif

  do {
    size_t ChunkSize = std::min(Size, MaxWriteSize);
    ssize_t ret = ::write(FD, Ptr, ChunkSize);

    if (ret < 0) {
      // If it's a recoverable error, swallow it and retry the write.
      //
      // Ideally we wouldn't ever see EAGAIN or EWOULDBLOCK here, since
      // raw_ostream isn't designed to do non-blocking I/O. However, some
      // programs, such as old versions of bjam, have mistakenly used
      // O_NONBLOCK. For compatibility, emulate blocking semantics by
      // spinning until the write succeeds. If you don't want spinning,
      // don't use O_NONBLOCK file descriptors with raw_ostream.
      if (errno == EINTR || errno == EAGAIN
#ifdef EWOULDBLOCK
          || errno == EWOULDBLOCK
#endif
          )
        continue;

      // Otherwise it's a non-recoverable error. Note it and quit.
      error_detected(std::error_code(errno, std::generic_category()));
      break;
    }

    // The write may have written some or all of the data. Update the
    // size and buffer pointer to reflect the remainder that needs
    // to be written. If there are no bytes left, we're done.
    Ptr += ret;
    Size -= ret;
  } while (Size > 0);
}